

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour_correspondence.hpp
# Opt level: O2

ContourLandmarks *
eos::fitting::ContourLandmarks::load(ContourLandmarks *__return_storage_ptr__,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  enable_if_t<detail::conjunction<std::is_integral<int>,_detail::negation<std::is_same<int,_bool>_>,_detail::negation<detail::is_exact_toml_type<int,_basic_value<discard_comments,_std::unordered_map,_std::vector>_>_>_>::value,_int>
  eVar3;
  value_type *this;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar4;
  type *ptVar5;
  runtime_error *prVar6;
  value_t t;
  value_t t_00;
  pointer pbVar7;
  string value;
  string local_e0;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> data;
  
  std::__cxx11::string::string((string *)&local_98,(string *)filename);
  toml::parse<toml::discard_comments,_std::unordered_map,_std::vector>(&data,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"contour_landmarks",(allocator<char> *)&local_e0);
  this = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::at
                   (&data,&value);
  this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::
               cast<(toml::value_t)10>(this);
  std::__cxx11::string::~string((string *)&value);
  (__return_storage_ptr__->left_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->left_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->right_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->left_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->right_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->right_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"right",(allocator<char> *)&local_e0);
  local_c0 = this_00;
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at(this_00,&value);
  ptVar5 = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::
           cast<(toml::value_t)9>(pmVar4);
  std::__cxx11::string::~string((string *)&value);
  pbVar7 = (ptVar5->
           super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (ptVar5->
           super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &value.field_2;
  do {
    if (pbVar7 == pbVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&value,"left",(allocator<char> *)&local_e0);
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at(local_c0,&value);
      ptVar5 = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::
               cast<(toml::value_t)9>(pmVar4);
      std::__cxx11::string::~string((string *)&value);
      pbVar7 = (ptVar5->
               super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (ptVar5->
               super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pbVar7 == pbVar2) {
          toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
                    (&data);
          return __return_storage_ptr__;
        }
        value._M_string_length = 0;
        value.field_2._M_local_buf[0] = '\0';
        if (pbVar7->type_ == string) {
          value._M_dataplus._M_p = (pointer)paVar1;
          toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_string
                    (pbVar7);
          std::__cxx11::string::_M_assign((string *)&value);
        }
        else {
          if (pbVar7->type_ != integer) {
            value._M_dataplus._M_p = (pointer)paVar1;
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            toml::stringize<char,std::char_traits<char>,std::allocator<char>>
                      (&local_b8,(toml *)(ulong)pbVar7->type_,t_00);
            std::operator+(&local_e0,"unexpected type : ",&local_b8);
            std::runtime_error::runtime_error(prVar6,(string *)&local_e0);
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          value._M_dataplus._M_p = (pointer)paVar1;
          eVar3 = toml::get<int,_toml::discard_comments,_std::unordered_map,_std::vector>(pbVar7);
          std::__cxx11::to_string(&local_e0,eVar3);
          std::__cxx11::string::operator=((string *)&value,(string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&__return_storage_ptr__->left_contour,&value);
        std::__cxx11::string::~string((string *)&value);
        pbVar7 = pbVar7 + 1;
      } while( true );
    }
    value._M_string_length = 0;
    value.field_2._M_local_buf[0] = '\0';
    if (pbVar7->type_ == string) {
      value._M_dataplus._M_p = (pointer)paVar1;
      toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_string(pbVar7);
      std::__cxx11::string::_M_assign((string *)&value);
    }
    else {
      if (pbVar7->type_ != integer) {
        value._M_dataplus._M_p = (pointer)paVar1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        toml::stringize<char,std::char_traits<char>,std::allocator<char>>
                  (&local_b8,(toml *)(ulong)pbVar7->type_,t);
        std::operator+(&local_e0,"unexpected type : ",&local_b8);
        std::runtime_error::runtime_error(prVar6,(string *)&local_e0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      value._M_dataplus._M_p = (pointer)paVar1;
      eVar3 = toml::get<int,_toml::discard_comments,_std::unordered_map,_std::vector>(pbVar7);
      std::__cxx11::to_string(&local_e0,eVar3);
      std::__cxx11::string::operator=((string *)&value,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&__return_storage_ptr__->right_contour,&value);
    std::__cxx11::string::~string((string *)&value);
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

static ContourLandmarks load(std::string filename)
    {
        // parse() as well as extracting the data can throw std::runtime error or toml::exception,
        // so ideally you'd want to call this c'tor within a try-catch.
        const auto data = toml::parse(filename);

        // Todo: Handle the case when '[contour_landmarks]' is empty - now it just throws. Use
        // std::unordered_map::count.
        const auto& contour_table = toml::get<toml::table>(data.at("contour_landmarks"));

        ContourLandmarks contour;
        // There might be a vector<string> or a vector<int>, we need to check for that and convert to vector<string>.
        // Todo: Again, check whether the key exists first.
        // Read all the "right" contour landmarks:
        const auto& right_contour = toml::get<std::vector<toml::value>>(contour_table.at("right"));
        for (const auto& landmark : right_contour)
        {
            std::string value;
            switch (landmark.type())
            {
            case toml::value_t::integer:
                value = std::to_string(toml::get<int>(landmark));
                break;
            case toml::value_t::string:
                value = toml::get<std::string>(landmark);
                break;
            default:
                throw std::runtime_error("unexpected type : " + toml::stringize(landmark.type()));
            }
            contour.right_contour.push_back(value);
        }
        // Now the same for all the "left" contour landmarks:
        const auto& left_contour = toml::get<std::vector<toml::value>>(contour_table.at("left"));
        for (const auto& landmark : left_contour)
        {
            std::string value;
            switch (landmark.type())
            {
            case toml::value_t::integer:
                value = std::to_string(toml::get<int>(landmark));
                break;
            case toml::value_t::string:
                value = toml::get<std::string>(landmark);
                break;
            default:
                throw std::runtime_error("unexpected type : " + toml::stringize(landmark.type()));
            }
            contour.left_contour.push_back(value);
        }

        return contour;
    }